

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall f8n::db::Statement::Statement(Statement *this,char *sql,Connection *connection)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  Connection *connection_local;
  char *sql_local;
  Statement *this_local;
  
  this->_vptr_Statement = (_func_int **)&PTR__Statement_00315150;
  this->stmt = (sqlite3_stmt *)0x0;
  this->connection = connection;
  this->modifiedRows = 0;
  lock._8_8_ = connection;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&connection->mutex);
  sqlite3_prepare_v2(this->connection->connection,sql,-1,&this->stmt,(char **)0x0);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

Statement::Statement(const char* sql, Connection &connection)
: connection(&connection)
, stmt(nullptr)
, modifiedRows(0) {
    std::unique_lock<std::mutex> lock(connection.mutex);

    sqlite3_prepare_v2(
        this->connection->connection, sql, -1, &this->stmt, nullptr);
}